

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O1

bool __thiscall
wasm::anon_unknown_0::RecGroupEquator::eq(RecGroupEquator *this,HeapType a,HeapType b)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  
  if (0xd < b.id && 0xd < a.id) {
    if (*(long *)(a.id + 0x18) == *(long *)(b.id + 0x18)) {
      uVar2 = a.id | 1;
      if (*(ulong *)(a.id + 0x10) != 0) {
        uVar2 = *(ulong *)(a.id + 0x10);
      }
      uVar1 = b.id | 1;
      if (*(ulong *)(b.id + 0x10) != 0) {
        uVar1 = *(ulong *)(b.id + 0x10);
      }
      bVar3 = uVar1 == (this->otherGroup).id;
      if (uVar2 != (this->newGroup).id) {
        bVar3 = uVar2 == uVar1 && !bVar3;
      }
    }
    else {
      bVar3 = false;
    }
    return bVar3;
  }
  return a.id == b.id;
}

Assistant:

constexpr bool isBasic() const { return id <= _last_basic_type; }